

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_stdout_and_stderr_to_file(void)

{
  undefined1 auVar1 [16];
  int iVar2;
  int64_t iVar3;
  uv_loop_t *puVar4;
  undefined8 uVar5;
  char *pcVar6;
  char *pcVar7;
  int64_t eval_b_1;
  int64_t eval_b_5;
  int64_t eval_b;
  ulong local_210;
  uv_stdio_container_t stdio [3];
  uv_fs_t fs_req;
  
  local_210 = eval_b;
  unlink("stdout_file");
  init_process_options("spawn_helper6",exit_cb);
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&fs_req,"stdout_file",0x42,0x180,(uv_fs_cb)0x0);
  iVar3 = (int64_t)iVar2;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_210;
  _eval_b = (uv_buf_t)(auVar1 << 0x40);
  stdio[0]._0_8_ = iVar3;
  if (iVar3 == 0) {
    uv_fs_req_cleanup(&fs_req);
    options.stdio = stdio;
    stdio[0]._0_8_ = stdio[0]._0_8_ & 0xffffffff00000000;
    stdio[1].flags = UV_INHERIT_FD;
    stdio[1].data.file = (uv_os_fd_t)fs_req.result;
    stdio[2].data.file = (uv_os_fd_t)fs_req.result;
    options.stdio_count = 3;
    stdio[2].flags = stdio[1].flags;
    puVar4 = uv_default_loop();
    iVar2 = uv_spawn(puVar4,&process,&options);
    eval_b = (int64_t)(long)iVar2;
    eval_b_1 = 0;
    if ((char *)(long)iVar2 == (char *)0x0) {
      puVar4 = uv_default_loop();
      iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
      eval_b = (int64_t)(long)iVar2;
      eval_b_1 = 0;
      if ((char *)(long)iVar2 == (char *)0x0) {
        eval_b = 1;
        eval_b_1 = (int64_t)exit_cb_called;
        if (eval_b_1 == 1) {
          eval_b = 1;
          eval_b_1 = (int64_t)close_cb_called;
          if (eval_b_1 == 1) {
            _eval_b = uv_buf_init(output,0x400);
            iVar2 = uv_fs_read((uv_loop_t *)0x0,&fs_req,(uv_os_fd_t)fs_req.result,
                               (uv_buf_t *)&eval_b,1,0,(uv_fs_cb)0x0);
            eval_b_1 = 0x1b;
            eval_b_5 = (int64_t)iVar2;
            if (eval_b_5 == 0x1b) {
              uv_fs_req_cleanup(&fs_req);
              iVar2 = uv_fs_close((uv_loop_t *)0x0,&fs_req,(uv_os_fd_t)fs_req.result,(uv_fs_cb)0x0);
              iVar3 = (int64_t)iVar2;
              eval_b_5 = 0;
              if (iVar3 == 0) {
                uv_fs_req_cleanup(&fs_req);
                printf("output is: %s",output);
                iVar2 = strcmp("hello world\nhello errworld\n",output);
                iVar3 = (int64_t)iVar2;
                eval_b_5 = 0;
                if (iVar3 == 0) {
                  unlink("stdout_file");
                  puVar4 = uv_default_loop();
                  close_loop(puVar4);
                  eval_b_1 = 0;
                  puVar4 = uv_default_loop();
                  iVar2 = uv_loop_close(puVar4);
                  eval_b_5 = (int64_t)iVar2;
                  if (eval_b_5 == 0) {
                    uv_library_shutdown();
                    return 0;
                  }
                  pcVar7 = "uv_loop_close(uv_default_loop())";
                  pcVar6 = "0";
                  uVar5 = 0x1a8;
                  iVar3 = eval_b_1;
                }
                else {
                  pcVar7 = "0";
                  pcVar6 = "strcmp(\"hello world\\nhello errworld\\n\", output)";
                  uVar5 = 0x1a3;
                }
              }
              else {
                pcVar7 = "0";
                pcVar6 = "r";
                uVar5 = 0x19f;
              }
            }
            else {
              pcVar7 = "r";
              pcVar6 = "27";
              uVar5 = 0x19b;
              iVar3 = eval_b_1;
            }
            goto LAB_00173374;
          }
          pcVar7 = "close_cb_called";
          pcVar6 = "1";
          uVar5 = 0x197;
        }
        else {
          pcVar7 = "exit_cb_called";
          pcVar6 = "1";
          uVar5 = 0x196;
        }
      }
      else {
        pcVar7 = "0";
        pcVar6 = "r";
        uVar5 = 0x194;
      }
    }
    else {
      pcVar7 = "0";
      pcVar6 = "r";
      uVar5 = 0x191;
    }
    iVar3 = eval_b;
    eval_b_5 = eval_b_1;
  }
  else {
    pcVar7 = "0";
    pcVar6 = "r";
    uVar5 = 0x184;
    eval_b_5 = 0;
  }
LAB_00173374:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
          ,uVar5,pcVar6,"==",pcVar7,iVar3,"==",eval_b_5);
  abort();
}

Assistant:

TEST_IMPL(spawn_stdout_and_stderr_to_file) {
  int r;
  uv_os_fd_t file;
  uv_fs_t fs_req;
  uv_stdio_container_t stdio[3];
  uv_buf_t buf;

  /* Setup. */
  unlink("stdout_file");

  init_process_options("spawn_helper6", exit_cb);

  r = uv_fs_open(NULL, &fs_req, "stdout_file", UV_FS_O_CREAT | UV_FS_O_RDWR,
      S_IRUSR | S_IWUSR, NULL);
  ASSERT_OK(r);
  file = (uv_os_fd_t)fs_req.result;
  uv_fs_req_cleanup(&fs_req);

  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_INHERIT_FD;
  options.stdio[1].data.file = file;
  options.stdio[2].flags = UV_INHERIT_FD;
  options.stdio[2].data.file = file;
  options.stdio_count = 3;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(1, close_cb_called);

  buf = uv_buf_init(output, sizeof(output));
  r = uv_fs_read(NULL, &fs_req, file, &buf, 1, 0, NULL);
  ASSERT_EQ(27, r);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, file, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT_OK(strcmp("hello world\nhello errworld\n", output));

  /* Cleanup. */
  unlink("stdout_file");

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}